

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O1

exr_result_t generic_unpack_deep(exr_decode_pipeline_t *decode)

{
  uint16_t uVar1;
  int iVar2;
  uint uVar3;
  exr_coding_channel_info_t *peVar4;
  uint uVar5;
  char cVar6;
  bool bVar7;
  char cVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  float *pfVar15;
  ulong uVar16;
  uint uVar17;
  float fVar18;
  float fVar19;
  void *pvVar20;
  ushort uVar21;
  int32_t *piVar22;
  bool bVar23;
  uint uVar24;
  long lVar25;
  long lVar26;
  int iVar27;
  ulong uVar28;
  
  iVar2 = (decode->chunk).height;
  if (0 < iVar2) {
    uVar3 = (decode->chunk).width;
    pvVar20 = decode->unpacked_buffer;
    piVar22 = decode->sample_count_table;
    lVar13 = 0;
    iVar10 = 0;
    do {
      uVar11 = (ulong)decode->channel_count;
      bVar23 = 0 < (long)uVar11;
      if (0 < (long)uVar11) {
        peVar4 = decode->channels;
        uVar14 = 0;
        do {
          uVar16 = uVar14 + 1;
          cVar8 = peVar4[uVar14].bytes_per_element;
          if (peVar4[uVar14].field_12.decode_to_ptr == (uint8_t *)0x0) {
            if ((decode->decode_flags & 1) == 0) {
              iVar9 = piVar22[(long)(int)uVar3 + -1];
            }
            else if ((int)uVar3 < 1) {
              iVar9 = 0;
            }
            else {
              uVar14 = 0;
              iVar9 = 0;
              do {
                iVar9 = iVar9 + piVar22[uVar14];
                uVar14 = uVar14 + 1;
              } while (uVar3 != uVar14);
            }
            lVar26 = (long)iVar9;
            pvVar20 = (void *)((long)pvVar20 + (int)cVar8 * lVar26);
            if (uVar16 != (uVar11 & 0xffffffff)) {
              lVar26 = 0;
            }
            lVar13 = lVar13 + lVar26;
            cVar8 = '\a';
          }
          else if ((int)uVar3 < 1) {
            cVar8 = '\0';
          }
          else {
            lVar26 = (long)peVar4[uVar14].user_bytes_per_element;
            pfVar15 = (float *)(peVar4[uVar14].field_12.decode_to_ptr + lVar13 * lVar26);
            uVar28 = 0;
            iVar9 = 0;
            do {
              iVar27 = iVar9;
              iVar12 = piVar22[uVar28];
              if ((decode->decode_flags & 1) != 0) {
                iVar27 = 0;
                iVar12 = iVar9;
              }
              iVar9 = iVar12;
              iVar27 = piVar22[uVar28] - iVar27;
              uVar1 = peVar4[uVar14].data_type;
              if (uVar1 == 0) {
                uVar1 = peVar4[uVar14].user_data_type;
                if (uVar1 == 2) {
                  if (0 < iVar27) {
                    lVar25 = 0;
                    do {
                      *pfVar15 = (float)*(uint *)((long)pvVar20 + lVar25 * 4);
                      pfVar15 = (float *)((long)pfVar15 + lVar26);
                      lVar25 = lVar25 + 1;
                    } while (iVar27 != (int)lVar25);
                  }
                }
                else if (uVar1 == 1) {
                  if (0 < iVar27) {
                    lVar25 = 0;
                    do {
                      uVar24 = *(uint *)((long)pvVar20 + lVar25 * 4);
                      uVar21 = 0x7c00;
                      if (uVar24 < 0xffe1) {
                        fVar18 = (float)(int)uVar24;
                        if ((uint)fVar18 < 0x38800000) {
                          if ((uint)fVar18 < 0x33000001) {
                            uVar21 = 0;
                          }
                          else {
                            uVar24 = (uint)fVar18 & 0x7fffff | 0x800000;
                            cVar6 = (char)((uint)fVar18 >> 0x17);
                            uVar21 = (ushort)(uVar24 >> (0x7eU - cVar6 & 0x1f));
                            if (0x80000000 < uVar24 << (cVar6 + 0xa2U & 0x1f)) {
                              uVar21 = uVar21 + 1;
                            }
                          }
                        }
                        else if ((uint)fVar18 < 0x7f800000) {
                          if ((uint)fVar18 < 0x477ff000) {
                            uVar21 = (ushort)((int)fVar18 + 0x8000fff +
                                              (uint)(((uint)fVar18 >> 0xd & 1) != 0) >> 0xd);
                          }
                        }
                        else if (fVar18 != INFINITY) {
                          uVar24 = (uint)fVar18 >> 0xd & 0x3ff;
                          uVar21 = (ushort)(uVar24 == 0) | (ushort)uVar24 | 0x7c00;
                        }
                      }
                      *(ushort *)pfVar15 = uVar21;
                      pfVar15 = (float *)((long)pfVar15 + lVar26);
                      lVar25 = lVar25 + 1;
                    } while (iVar27 != (int)lVar25);
                  }
                }
                else {
                  if (uVar1 != 0) goto LAB_001276ee;
                  if (0 < iVar27) {
                    lVar25 = 0;
                    do {
                      *pfVar15 = *(float *)((long)pvVar20 + lVar25 * 4);
                      pfVar15 = (float *)((long)pfVar15 + lVar26);
                      lVar25 = lVar25 + 1;
                    } while (iVar27 != (int)lVar25);
                  }
                }
LAB_00127a04:
                lVar25 = (long)iVar27;
                pvVar20 = (void *)((long)pvVar20 + (long)(iVar27 * cVar8));
                if (uVar16 != (uVar11 & 0xffffffff)) {
                  lVar25 = 0;
                }
                lVar13 = lVar13 + lVar25;
                bVar7 = true;
              }
              else {
                if (uVar1 == 2) {
                  uVar1 = peVar4[uVar14].user_data_type;
                  if (uVar1 == 2) {
                    if (0 < iVar27) {
                      lVar25 = 0;
                      do {
                        *pfVar15 = *(float *)((long)pvVar20 + lVar25 * 4);
                        pfVar15 = (float *)((long)pfVar15 + lVar26);
                        lVar25 = lVar25 + 1;
                      } while (iVar27 != (int)lVar25);
                    }
                  }
                  else if (uVar1 == 1) {
                    if (0 < iVar27) {
                      lVar25 = 0;
                      do {
                        uVar24 = *(uint *)((long)pvVar20 + lVar25 * 4);
                        uVar17 = uVar24 & 0x7fffffff;
                        uVar21 = (ushort)(uVar24 >> 0x10) & 0x8000;
                        if (uVar17 < 0x38800000) {
                          if ((0x33000000 < uVar17) &&
                             (uVar24 = uVar24 & 0x7fffff | 0x800000, cVar6 = (char)(uVar17 >> 0x17),
                             uVar21 = uVar21 | (ushort)(uVar24 >> (0x7eU - cVar6 & 0x1f)),
                             0x80000000 < uVar24 << (cVar6 + 0xa2U & 0x1f))) {
                            uVar21 = uVar21 + 1;
                          }
                        }
                        else if (uVar17 < 0x7f800000) {
                          if (uVar17 < 0x477ff000) {
                            uVar21 = (ushort)(uVar17 + 0x8000fff + (uint)((uVar17 >> 0xd & 1) != 0)
                                             >> 0xd) | uVar21;
                          }
                          else {
                            uVar21 = uVar21 | 0x7c00;
                          }
                        }
                        else {
                          uVar21 = uVar21 | 0x7c00;
                          if (uVar17 != 0x7f800000) {
                            uVar24 = uVar17 >> 0xd & 0x3ff;
                            uVar21 = uVar21 | (ushort)uVar24 | (ushort)(uVar24 == 0);
                          }
                        }
                        *(ushort *)pfVar15 = uVar21;
                        pfVar15 = (float *)((long)pfVar15 + lVar26);
                        lVar25 = lVar25 + 1;
                      } while (iVar27 != (int)lVar25);
                    }
                  }
                  else {
                    if (uVar1 != 0) goto LAB_001276ee;
                    if (0 < iVar27) {
                      lVar25 = 0;
                      do {
                        fVar18 = *(float *)((long)pvVar20 + lVar25 * 4);
                        fVar19 = 0.0;
                        if (0.0 <= fVar18) {
                          fVar19 = (float)(long)fVar18;
                          if (ABS(fVar18) == INFINITY) {
                            fVar19 = -NAN;
                          }
                          if (4.2949673e+09 < fVar18) {
                            fVar19 = -NAN;
                          }
                        }
                        *pfVar15 = fVar19;
                        pfVar15 = (float *)((long)pfVar15 + lVar26);
                        lVar25 = lVar25 + 1;
                      } while (iVar27 != (int)lVar25);
                    }
                  }
                  goto LAB_00127a04;
                }
                if (uVar1 == 1) {
                  uVar1 = peVar4[uVar14].user_data_type;
                  if (uVar1 == 2) {
                    if (0 < iVar27) {
                      lVar25 = 0;
                      do {
                        uVar24 = (uint)*(short *)((long)pvVar20 + lVar25 * 2);
                        uVar17 = (uVar24 & 0x7fff) << 0xd;
                        fVar18 = (float)(uVar24 & 0x80000000);
                        if (uVar17 < 0x800000) {
                          if ((uVar24 & 0x7fff) != 0) {
                            uVar5 = 0x1f;
                            if ((uVar24 & 0x7fff) != 0) {
                              for (; uVar17 >> uVar5 == 0; uVar5 = uVar5 - 1) {
                              }
                            }
                            iVar12 = (uVar5 ^ 0x1f) - 8;
                            fVar18 = (float)(((uint)fVar18 | uVar17 << ((byte)iVar12 & 0x1f) |
                                             0x38800000) + iVar12 * -0x800000);
                          }
                        }
                        else if (uVar17 < 0xf800000) {
                          fVar18 = (float)(((uint)fVar18 | uVar17) + 0x38000000);
                        }
                        else {
                          fVar18 = (float)((uint)fVar18 | uVar17 | 0x7f800000);
                        }
                        *pfVar15 = fVar18;
                        pfVar15 = (float *)((long)pfVar15 + lVar26);
                        lVar25 = lVar25 + 1;
                      } while (iVar27 != (int)lVar25);
                    }
                  }
                  else if (uVar1 == 1) {
                    if (0 < iVar27) {
                      lVar25 = 0;
                      do {
                        *(ushort *)pfVar15 = *(ushort *)((long)pvVar20 + lVar25 * 2);
                        pfVar15 = (float *)((long)pfVar15 + lVar26);
                        lVar25 = lVar25 + 1;
                      } while (iVar27 != (int)lVar25);
                    }
                  }
                  else {
                    if (uVar1 != 0) goto LAB_001276ee;
                    if (0 < iVar27) {
                      lVar25 = 0;
                      do {
                        uVar21 = *(ushort *)((long)pvVar20 + lVar25 * 2);
                        uVar24 = (uint)uVar21;
                        if ((short)uVar21 < 0) {
                          fVar18 = 0.0;
                        }
                        else if ((~uVar24 & 0x7c00) == 0) {
                          fVar18 = (float)-(uint)((uVar21 & 0x3ff) == 0);
                        }
                        else {
                          uVar17 = uVar24 * 0x2000;
                          if (uVar24 < 0x400) {
                            if (uVar21 == 0) {
                              fVar18 = 0.0;
                            }
                            else {
                              uVar5 = 0x1f;
                              if (uVar24 != 0) {
                                for (; uVar17 >> uVar5 == 0; uVar5 = uVar5 - 1) {
                                }
                              }
                              iVar12 = (uVar5 ^ 0x1f) - 8;
                              fVar18 = (float)((uVar17 << ((byte)iVar12 & 0x1f) | 0x38800000) +
                                              iVar12 * -0x800000);
                            }
                          }
                          else if (uVar24 < 0x7c00) {
                            fVar18 = (float)(uVar17 + 0x38000000);
                          }
                          else {
                            fVar18 = (float)(uVar17 | 0x7f800000);
                          }
                          fVar18 = (float)(long)fVar18;
                        }
                        *pfVar15 = fVar18;
                        pfVar15 = (float *)((long)pfVar15 + lVar26);
                        lVar25 = lVar25 + 1;
                      } while (iVar27 != (int)lVar25);
                    }
                  }
                  goto LAB_00127a04;
                }
LAB_001276ee:
                bVar7 = false;
              }
              if (!bVar7) {
                cVar8 = '\x01';
                goto LAB_00127aba;
              }
              uVar28 = uVar28 + 1;
            } while (uVar28 != uVar3);
            cVar8 = '\0';
          }
LAB_00127aba:
          if ((cVar8 != '\a') && (cVar8 != '\0')) break;
          uVar11 = (ulong)decode->channel_count;
          bVar23 = (long)uVar16 < (long)uVar11;
          uVar14 = uVar16;
        } while ((long)uVar16 < (long)uVar11);
      }
      if (bVar23) {
        return 3;
      }
      piVar22 = piVar22 + (int)uVar3;
      iVar10 = iVar10 + 1;
    } while (iVar10 != iVar2);
  }
  return 0;
}

Assistant:

static exr_result_t
generic_unpack_deep (exr_decode_pipeline_t* decode)
{
    const uint8_t* srcbuffer  = (const uint8_t*) decode->unpacked_buffer;
    const int32_t* sampbuffer = decode->sample_count_table;
    uint8_t*       cdata;
    int            w, h, bpc, ubpc;
    size_t         totsamps = 0;

    w = decode->chunk.width;
    h = decode->chunk.height;

    for (int y = 0; y < h; ++y)
    {
        for (int c = 0; c < decode->channel_count; ++c)
        {
            exr_coding_channel_info_t* decc      = (decode->channels + c);
            int32_t                    prevsamps = 0;

            int incr_tot = ((c + 1) == decode->channel_count);

            bpc   = decc->bytes_per_element;
            ubpc  = decc->user_bytes_per_element;
            cdata = decc->decode_to_ptr;

            if (!cdata)
            {
                prevsamps = 0;
                if ((decode->decode_flags &
                     EXR_DECODE_SAMPLE_COUNTS_AS_INDIVIDUAL))
                {
                    for (int x = 0; x < w; ++x)
                        prevsamps += sampbuffer[x];
                }
                else
                    prevsamps = sampbuffer[w - 1];
                srcbuffer += ((size_t) bpc) * ((size_t) prevsamps);

                if (incr_tot) totsamps += (size_t) prevsamps;

                continue;
            }
            cdata += totsamps * ((size_t) ubpc);

            for (int x = 0; x < w; ++x)
            {
                int32_t samps = sampbuffer[x];
                if (0 == (decode->decode_flags &
                          EXR_DECODE_SAMPLE_COUNTS_AS_INDIVIDUAL))
                {
                    int32_t tmp = samps - prevsamps;
                    prevsamps   = samps;
                    samps       = tmp;
                }

                UNPACK_SAMPLES (samps)

                srcbuffer += bpc * samps;
                if (incr_tot) totsamps += (size_t) samps;
            }
        }
        sampbuffer += w;
    }

    return EXR_ERR_SUCCESS;
}